

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waiter.cc
# Opt level: O2

bool __thiscall absl::synchronization_internal::Waiter::Wait(Waiter *this,KernelTimeout t)

{
  int iVar1;
  uint uVar2;
  ThreadIdentity *pTVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  
  bVar4 = true;
  while( true ) {
    do {
      iVar1 = (this->futex_).super___atomic_base<int>._M_i;
      while (iVar5 = iVar1, iVar5 != 0) {
        LOCK();
        iVar1 = (this->futex_).super___atomic_base<int>._M_i;
        bVar6 = iVar5 == iVar1;
        if (bVar6) {
          (this->futex_).super___atomic_base<int>._M_i = iVar5 + -1;
          iVar1 = iVar5;
        }
        UNLOCK();
        if (bVar6) goto LAB_0013ae7f;
      }
      if (!bVar4) {
        pTVar3 = base_internal::CurrentThreadIdentityIfPresent();
        if (pTVar3 == (ThreadIdentity *)0x0) {
          __assert_fail("identity != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/synchronization/internal/waiter.cc"
                        ,0x3b,"void absl::synchronization_internal::MaybeBecomeIdle()");
        }
        if ((((pTVar3->is_idle)._M_base._M_i & 1U) == 0) &&
           (0x3c < (pTVar3->ticker).super___atomic_base<int>._M_i -
                   (pTVar3->wait_start).super___atomic_base<int>._M_i)) {
          (pTVar3->is_idle)._M_base._M_i = true;
        }
      }
      bVar4 = false;
      uVar2 = FutexImpl::WaitUntil(&this->futex_,0,t);
    } while ((uVar2 + 0xb < 0xc) && ((0x881U >> (uVar2 + 0xb & 0x1f) & 1) != 0));
    if (uVar2 == 0xffffff92) break;
    bVar4 = false;
    raw_logging_internal::RawLog
              (kFatal,"waiter.cc",100,"Futex operation failed with error %d\n",(ulong)uVar2);
  }
LAB_0013ae7f:
  return iVar5 != 0;
}

Assistant:

bool Waiter::Wait(KernelTimeout t) {
  // Loop until we can atomically decrement futex from a positive
  // value, waiting on a futex while we believe it is zero.
  // Note that, since the thread ticker is just reset, we don't need to check
  // whether the thread is idle on the very first pass of the loop.
  bool first_pass = true;

  while (true) {
    int32_t x = futex_.load(std::memory_order_relaxed);
    while (x != 0) {
      if (!futex_.compare_exchange_weak(x, x - 1,
                                        std::memory_order_acquire,
                                        std::memory_order_relaxed)) {
        continue;  // Raced with someone, retry.
      }
      return true;  // Consumed a wakeup, we are done.
    }

    if (!first_pass) MaybeBecomeIdle();
    const int err = Futex::WaitUntil(&futex_, 0, t);
    if (err != 0) {
      if (err == -EINTR || err == -EWOULDBLOCK) {
        // Do nothing, the loop will retry.
      } else if (err == -ETIMEDOUT) {
        return false;
      } else {
        ABSL_RAW_LOG(FATAL, "Futex operation failed with error %d\n", err);
      }
    }
    first_pass = false;
  }
}